

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsoncheck.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  bool bVar1;
  ostream *poVar2;
  undefined8 *in_RSI;
  int in_EDI;
  char *in_stack_00000178;
  uint local_4;
  
  if (in_EDI == 2) {
    bVar1 = validate(in_stack_00000178);
  }
  else {
    poVar2 = std::operator<<((ostream *)&std::cerr,"Usage: ");
    poVar2 = std::operator<<(poVar2,(char *)*in_RSI);
    poVar2 = std::operator<<(poVar2," <directorywithjsonfiles>");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    poVar2 = std::operator<<((ostream *)&std::cout,"We are going to assume you mean to use the \'");
    poVar2 = std::operator<<(poVar2,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/Gian99Santos[P]simdjson/jsonchecker/"
                            );
    poVar2 = std::operator<<(poVar2,"\' directory.");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    bVar1 = validate(in_stack_00000178);
  }
  local_4 = (uint)!bVar1;
  return local_4;
}

Assistant:

int main(int argc, char *argv[]) {
  if (argc != 2) {
    std::cerr << "Usage: " << argv[0] << " <directorywithjsonfiles>"
              << std::endl;
#ifndef SIMDJSON_TEST_DATA_DIR
    std::cout
        << "We are going to assume you mean to use the 'jsonchecker' directory."
        << std::endl;
    return validate("jsonchecker/") ? EXIT_SUCCESS : EXIT_FAILURE;
#else
    std::cout
        << "We are going to assume you mean to use the '"<< SIMDJSON_TEST_DATA_DIR <<"' directory."
        << std::endl;
    return validate(SIMDJSON_TEST_DATA_DIR) ? EXIT_SUCCESS : EXIT_FAILURE;
#endif
  }
  return validate(argv[1]) ? EXIT_SUCCESS : EXIT_FAILURE;
}